

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O1

void absl::lts_20240722::cord_internal::anon_unknown_0::
     AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
               (CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1> rep,
               RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
               *raw_usage)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  
  raw_usage->total = raw_usage->total + 0x40;
  if ((rep.rep)->tag != '\x03') {
    __assert_fail("IsBtree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x25c,"const CordRepBtree *absl::cord_internal::CordRep::btree() const");
  }
  bVar1 = (rep.rep)->storage[1];
  bVar2 = (rep.rep)->storage[2];
  if ((rep.rep)->storage[0] == '\0') {
    if (bVar1 != bVar2) {
      lVar4 = (ulong)bVar1 << 3;
      do {
        AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
                  (*(Nonnull<const_CordRep_*> *)(rep.rep[1].storage + lVar4 + -0xd),raw_usage);
        lVar4 = lVar4 + 8;
      } while ((ulong)bVar2 * 8 != lVar4);
    }
  }
  else if (bVar1 != bVar2) {
    uVar3 = (ulong)((uint)bVar1 * 8);
    do {
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
                (*(Nonnull<const_CordRep_*> *)(rep.rep[1].storage + (uVar3 - 0xd)),raw_usage);
      uVar3 = uVar3 + 8;
    } while ((ulong)bVar2 * 8 != uVar3);
  }
  return;
}

Assistant:

void Add(size_t size, CordRepRef<mode>) { total += size; }